

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_DimStyle_*>::Append(ON_SimpleArray<ON_DimStyle_*> *this,ON_DimStyle **x)

{
  ON_DimStyle *pOVar1;
  int iVar2;
  ON_DimStyle **ppOVar3;
  ON_DimStyle **ppOVar4;
  
  iVar2 = this->m_count;
  ppOVar3 = x;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      ppOVar3 = (ON_DimStyle **)onmalloc(8);
      *ppOVar3 = *x;
    }
    Reserve(this,(long)iVar2);
    ppOVar4 = this->m_a;
    if (ppOVar4 == (ON_DimStyle **)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar2 = this->m_count;
  }
  else {
    ppOVar4 = this->m_a;
  }
  pOVar1 = *ppOVar3;
  this->m_count = iVar2 + 1;
  ppOVar4[iVar2] = pOVar1;
  if (ppOVar3 != x) {
    onfree(ppOVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}